

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_Grp17.c
# Opt level: O0

void G17_(PDISASM pMyDisasm)

{
  int iVar1;
  PDISASM pMyDisasm_local;
  
  iVar1 = Security(2,pMyDisasm);
  if (iVar1 != 0) {
    (pMyDisasm->Reserved_).REGOPCODE =
         (int)(uint)*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 3 & 7;
    if ((pMyDisasm->Reserved_).REGOPCODE == 1) {
      if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
        (pMyDisasm->Instruction).Category = 0x110003;
        strcpy((pMyDisasm->Instruction).Mnemonic,"blsr");
        if ((pMyDisasm->Reserved_).VEX.opcode == 0xc4) {
          if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
            (pMyDisasm->Reserved_).OperandSize = 0x40;
            (pMyDisasm->Reserved_).MemDecoration = 0x68;
            fillRegister((((pMyDisasm->Reserved_).VEX.vvvv ^ 0xffffffff) & 0xf) +
                         (uint)(pMyDisasm->Reserved_).EVEX.V * 0x10,&pMyDisasm->Operand1,pMyDisasm);
            decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
          }
          else {
            (pMyDisasm->Reserved_).MemDecoration = 0x67;
            fillRegister((((pMyDisasm->Reserved_).VEX.vvvv ^ 0xffffffff) & 0xf) +
                         (uint)(pMyDisasm->Reserved_).EVEX.V * 0x10,&pMyDisasm->Operand1,pMyDisasm);
            decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
          }
        }
      }
      else {
        failDecode(pMyDisasm);
      }
    }
    else if ((pMyDisasm->Reserved_).REGOPCODE == 2) {
      if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
        (pMyDisasm->Instruction).Category = 0x110003;
        strcpy((pMyDisasm->Instruction).Mnemonic,"blmsk");
        if ((pMyDisasm->Reserved_).VEX.opcode == 0xc4) {
          if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
            (pMyDisasm->Reserved_).OperandSize = 0x40;
            (pMyDisasm->Reserved_).MemDecoration = 0x68;
            fillRegister((((pMyDisasm->Reserved_).VEX.vvvv ^ 0xffffffff) & 0xf) +
                         (uint)(pMyDisasm->Reserved_).EVEX.V * 0x10,&pMyDisasm->Operand1,pMyDisasm);
            decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
          }
          else {
            (pMyDisasm->Reserved_).MemDecoration = 0x67;
            fillRegister((((pMyDisasm->Reserved_).VEX.vvvv ^ 0xffffffff) & 0xf) +
                         (uint)(pMyDisasm->Reserved_).EVEX.V * 0x10,&pMyDisasm->Operand1,pMyDisasm);
            decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
          }
        }
      }
      else {
        failDecode(pMyDisasm);
      }
    }
    else if ((pMyDisasm->Reserved_).REGOPCODE == 3) {
      if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
        (pMyDisasm->Instruction).Category = 0x110003;
        strcpy((pMyDisasm->Instruction).Mnemonic,"blsi");
        if ((pMyDisasm->Reserved_).VEX.opcode == 0xc4) {
          if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
            (pMyDisasm->Reserved_).OperandSize = 0x40;
            (pMyDisasm->Reserved_).MemDecoration = 0x68;
            fillRegister((((pMyDisasm->Reserved_).VEX.vvvv ^ 0xffffffff) & 0xf) +
                         (uint)(pMyDisasm->Reserved_).EVEX.V * 0x10,&pMyDisasm->Operand1,pMyDisasm);
            decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
          }
          else {
            (pMyDisasm->Reserved_).MemDecoration = 0x67;
            fillRegister((((pMyDisasm->Reserved_).VEX.vvvv ^ 0xffffffff) & 0xf) +
                         (uint)(pMyDisasm->Reserved_).EVEX.V * 0x10,&pMyDisasm->Operand1,pMyDisasm);
            decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
          }
        }
      }
      else {
        failDecode(pMyDisasm);
      }
    }
    else {
      failDecode(pMyDisasm);
    }
    (pMyDisasm->Reserved_).EIP_ =
         (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
  }
  return;
}

Assistant:

void __bea_callspec__ G17_(PDISASM pMyDisasm)
{
  if (!Security(2, pMyDisasm)) return;
  GV.REGOPCODE = ((*((UInt8*) (GV.EIP_+1))) >> 3) & 0x7;
  if (GV.REGOPCODE == 1) {
    if (GV.VEX.state == InUsePrefix) {
      pMyDisasm->Instruction.Category = AVX_INSTRUCTION + LOGICAL_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "blsr");
      #endif
      if (GV.VEX.opcode == 0xc4) {
        /* using VEX3Bytes */
        if (GV.REX.W_ == 0x1) {
          GV.OperandSize = 64;
          GV.MemDecoration = Arg2qword;
          fillRegister((~GV.VEX.vvvv & 0xF) + 16 * GV.EVEX.V, &pMyDisasm->Operand1, pMyDisasm);
          decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
        }
        else {
          GV.MemDecoration = Arg2dword;
          fillRegister((~GV.VEX.vvvv & 0xF) + 16 * GV.EVEX.V, &pMyDisasm->Operand1, pMyDisasm);
          decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
        }
      }
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else if (GV.REGOPCODE == 2) {
    if (GV.VEX.state == InUsePrefix) {
      pMyDisasm->Instruction.Category = AVX_INSTRUCTION + LOGICAL_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "blmsk");
      #endif
      if (GV.VEX.opcode == 0xc4) {
        /* using VEX3Bytes */
        if (GV.REX.W_ == 0x1) {
            GV.OperandSize = 64;
            GV.MemDecoration = Arg2qword;
            fillRegister((~GV.VEX.vvvv & 0xF) + 16 * GV.EVEX.V, &pMyDisasm->Operand1, pMyDisasm);
            decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
        }
        else {
            GV.MemDecoration = Arg2dword;
            fillRegister((~GV.VEX.vvvv & 0xF) + 16 * GV.EVEX.V, &pMyDisasm->Operand1, pMyDisasm);
            decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
        }
      }
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else if (GV.REGOPCODE == 3) {
    if (GV.VEX.state == InUsePrefix) {
      pMyDisasm->Instruction.Category = AVX_INSTRUCTION + LOGICAL_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "blsi");
      #endif
      if (GV.VEX.opcode == 0xc4) {
        /* using VEX3Bytes */
        if (GV.REX.W_ == 0x1) {
          GV.OperandSize = 64;
          GV.MemDecoration = Arg2qword;
          fillRegister((~GV.VEX.vvvv & 0xF) + 16 * GV.EVEX.V, &pMyDisasm->Operand1, pMyDisasm);
          decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
        }
        else {
          GV.MemDecoration = Arg2dword;
          fillRegister((~GV.VEX.vvvv & 0xF) + 16 * GV.EVEX.V, &pMyDisasm->Operand1, pMyDisasm);
          decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
        }
      }

    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    failDecode(pMyDisasm);
  }
  GV.EIP_+= GV.DECALAGE_EIP + 2;
}